

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_strtof(char *str,float *value)

{
  int *piVar1;
  float *in_RSI;
  char *in_RDI;
  float fVar2;
  char *endptr;
  bool local_19;
  char *local_18;
  float *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  piVar1 = __errno_location();
  *piVar1 = 0;
  fVar2 = strtof(local_8,&local_18);
  *local_10 = fVar2;
  local_19 = false;
  if ((*local_8 != '\0') && (local_19 = false, *local_18 == '\0')) {
    piVar1 = __errno_location();
    local_19 = *piVar1 == 0;
  }
  return local_19;
}

Assistant:

bool safe_strtof(const char* str, float* value) {
  char* endptr;
  errno = 0;  // errno only gets set on errors
#if defined(_WIN32) || defined (__hpux)  // has no strtof()
  *value = io::NoLocaleStrtod(str, &endptr);
#else
  *value = strtof(str, &endptr);
#endif
  return *str != 0 && *endptr == 0 && errno == 0;
}